

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void AdditionHelper<signed_char,int,6>::
     AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (char *lhs,int *rhs,char *result)

{
  code *pcVar1;
  char cVar2;
  long lVar3;
  undefined1 *in_RDX;
  int *in_RSI;
  char *in_RDI;
  int64_t tmp;
  
  lVar3 = (long)*in_RDI + (long)*in_RSI;
  if (SCARRY8((long)*in_RDI,(long)*in_RSI)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  cVar2 = std::numeric_limits<signed_char>::max();
  if (lVar3 <= cVar2) {
    cVar2 = std::numeric_limits<signed_char>::min();
    if (cVar2 <= lVar3) {
      *in_RDX = (char)lVar3;
      return;
    }
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

TestVector() : test_cases(nullptr), count(0), current(0) {}